

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O0

void __thiscall QMakeSourceFileInfo::QMakeSourceFileInfo(QMakeSourceFileInfo *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR_fixPathForFile_003ba028;
  QList<QMakeLocalFileName>::QList((QList<QMakeLocalFileName> *)0x1d02ce);
  QList<QString>::QList((QList<QString> *)0x1d02dc);
  *(undefined4 *)((long)in_RDI + 0x5c) = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  *(undefined1 *)(in_RDI + 3) = 0;
  in_RDI[10] = 0;
  *(undefined4 *)(in_RDI + 0xb) = 0;
  return;
}

Assistant:

QMakeSourceFileInfo::QMakeSourceFileInfo()
{
    //dep_mode
    dep_mode = Recursive;

    //quick project lookups
    includes = files = nullptr;
    files_changed = false;

    //buffer
    spare_buffer = nullptr;
    spare_buffer_size = 0;
}